

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<ParamsStream<DataStream&,TransactionSerParams>,std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
               (ParamsStream<DataStream_&,_TransactionSerParams> *is,
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *v)

{
  long lVar1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_RSI;
  ParamsStream<DataStream_&,_TransactionSerParams> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VectorFormatter<DefaultFormatter>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>&>
            (in_RSI);
  Unserialize<ParamsStream<DataStream_&,_TransactionSerParams>,_Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_&>_>
            (in_RDI,(Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_&>
                     *)0x17dca6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}